

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimClassRefineOne(Cec_ManSim_t *p,int i)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Man_t *pGVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = 0;
  while( true ) {
    p_00 = p->vClassOld;
    p_00->nSize = 0;
    p->vClassNew->nSize = 0;
    Vec_IntPush(p_00,i);
    pGVar3 = p->pAig;
    if (((~(uint)pGVar3->pReprs[i] & 0xfffffff) != 0) || (pGVar3->pNexts[i] < 1)) {
      __assert_fail("Gia_ObjIsHead(p->pAig, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x114,"int Cec_ManSimClassRefineOne(Cec_ManSim_t *, int)");
    }
    iVar8 = pGVar3->pNexts[i];
    if (iVar8 != 0) {
      puVar4 = p->pMems;
      iVar1 = p->pSimInfo[i];
      do {
        puVar5 = p->pMems;
        iVar2 = p->pSimInfo[iVar8];
        iVar6 = Cec_ManSimCompareEqual(puVar4 + (long)iVar1 + 1,puVar5 + (long)iVar2 + 1,p->nWords);
        if (iVar6 == 0) {
          Vec_IntPush(p->vClassNew,iVar8);
          if (p->pBestState != (Abc_Cex_t *)0x0) {
            Cec_ManSimCompareEqualScore
                      (puVar4 + (long)iVar1 + 1,puVar5 + (long)iVar2 + 1,p->nWords,p->pScores);
          }
        }
        else {
          Vec_IntPush(p->vClassOld,iVar8);
        }
        iVar8 = p->pAig->pNexts[iVar8];
      } while (iVar8 != 0);
    }
    if (p->vClassNew->nSize == 0) break;
    Cec_ManSimClassCreate(p->pAig,p->vClassOld);
    Cec_ManSimClassCreate(p->pAig,p->vClassNew);
    if (p->vClassNew->nSize < 2) {
      iVar8 = 1;
      goto LAB_005c2f71;
    }
    i = *p->vClassNew->pArray;
    iVar7 = iVar7 + 1;
  }
  iVar8 = 0;
LAB_005c2f71:
  return iVar7 + iVar8;
}

Assistant:

int Cec_ManSimClassRefineOne( Cec_ManSim_t * p, int i )
{
    unsigned * pSim0, * pSim1;
    int Ent;
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Vec_IntPush( p->vClassOld, i );
    pSim0 = Cec_ObjSim(p, i);
    Gia_ClassForEachObj1( p->pAig, i, Ent )
    {
        pSim1 = Cec_ObjSim(p, Ent);
        if ( Cec_ManSimCompareEqual( pSim0, pSim1, p->nWords ) )
            Vec_IntPush( p->vClassOld, Ent );
        else
        {
            Vec_IntPush( p->vClassNew, Ent );
            if ( p->pBestState )
                Cec_ManSimCompareEqualScore( pSim0, pSim1, p->nWords, p->pScores );
        }
    }
    if ( Vec_IntSize( p->vClassNew ) == 0 )
        return 0;
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    if ( Vec_IntSize(p->vClassNew) > 1 )
        return 1 + Cec_ManSimClassRefineOne( p, Vec_IntEntry(p->vClassNew,0) );
    return 1;
}